

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O0

void __thiscall FR<8U>::Init(FR<8U> *this,Data<8U> *data)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  Data<8U> *in_RSI;
  Data<8U> *in_RDI;
  uint position_1;
  int i_1;
  uint position;
  int i;
  bool init;
  uint in_stack_ffffffffffffffcc;
  int local_20;
  int local_18;
  
  bVar1 = true;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    uVar3 = Data<8U>::Hash(in_RDI,in_stack_ffffffffffffffcc);
    uVar5 = uVar3 % *(uint *)(in_RDI[0x10].str + 4);
    bVar2 = BitSet::Get(*(BitSet **)in_RDI[0xe].str,uVar5);
    if (!bVar2) {
      bVar1 = false;
      BitSet::Set(*(BitSet **)in_RDI[0xe].str,uVar5);
    }
  }
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    uVar3 = Data<8U>::Hash(in_RDI,in_stack_ffffffffffffffcc);
    uVar5 = uVar3 % *(uint *)in_RDI[0x11].str;
    if (!bVar1) {
      *(int *)in_RDI[0x10].str = *(int *)in_RDI[0x10].str + 1;
      Data<8U>::operator^=((Data<8U> *)(*(long *)in_RDI[0xf].str + (ulong)uVar5 * 0x10),in_RSI);
      lVar4 = *(long *)in_RDI[0xf].str + (ulong)uVar5 * 0x10;
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
    }
    lVar4 = *(long *)in_RDI[0xf].str + (ulong)uVar5 * 0x10;
    *(int *)(lVar4 + 0xc) = *(int *)(lVar4 + 0xc) + 1;
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& data) {
		bool init = true;
		for (int i = 0; i < 3; ++i) {
			uint position = data.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		for (int i = 0; i < 2; ++i) {
			uint position = data.Hash(i) % SIZE;
			if (!init) {
				flow++;
				counter[position].data ^= data;
				counter[position].count += 1;
			}
			counter[position].packet += 1;
		}
	}